

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall lzham::lzcompressor::lzcompressor(lzcompressor *this)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  
  (this->m_params).m_pTask_pool = (task_pool *)0x0;
  (this->m_params).m_max_helper_threads = 0;
  (this->m_params).m_compression_level = cCompressionLevelDefault;
  (this->m_params).m_dict_size_log2 = 0x16;
  (this->m_params).m_block_size = 0x80000;
  (this->m_params).m_num_cachelines = 0;
  (this->m_params).m_cacheline_size = 0;
  (this->m_params).m_lzham_compress_flags = 0;
  this->m_src_size = -1;
  this->m_src_adler32 = 0;
  search_accelerator::search_accelerator(&this->m_accel);
  symbol_codec::symbol_codec(&this->m_codec);
  memset(&this->m_stats,0,0xa54);
  memset(&(this->m_stats).m_total_delta_lit_cost,0,0x14d5);
  state::state(&this->m_initial_state);
  state::state(&this->m_state);
  this->m_num_parse_threads = 0;
  lVar3 = 0;
  do {
    state::state((state *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                 m_approx_state.super_state_base.m_match_hist + lVar3 + -8));
    puVar1 = (undefined8 *)
             ((long)&this->m_parse_thread_state[0].super_raw_parse_thread_state.m_best_decisions.m_p
             + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0xb2b00;
  } while (lVar3 != 0x595800);
  this->m_parse_jobs_remaining = 0;
  iVar2 = sem_init((sem_t *)&this->m_parse_jobs_complete,0,0);
  if (iVar2 != 0) {
    lzham_fail("\"semaphore: sem_init() failed\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
               ,0x1c);
  }
  return;
}

Assistant:

lzcompressor::lzcompressor() :
      m_src_size(-1),
      m_src_adler32(0),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_num_parse_threads(0),
      m_parse_jobs_remaining(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);
   }